

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int reason_code_to_str(char *str,size_t len,http_reason_code_t rt)

{
  size_t sVar1;
  size_t reason_code_size;
  http_reason_code_t rt_local;
  size_t len_local;
  char *str_local;
  
  if (rt == OK) {
    sVar1 = strlen(reason_code_name[3]);
    if (len <= sVar1) {
      return 3;
    }
    strcpy(str,reason_code_name[3]);
  }
  else if (rt == Bad_Request) {
    sVar1 = strlen(reason_code_name[0]);
    if (len <= sVar1) {
      return 1;
    }
    strcpy(str,reason_code_name[0]);
  }
  else if (rt == Not_found) {
    sVar1 = strlen(reason_code_name[1]);
    if (len <= sVar1) {
      return 2;
    }
    strcpy(str,reason_code_name[1]);
  }
  else if (rt == Entity_Too_Large) {
    sVar1 = strlen(reason_code_name[2]);
    if (len <= sVar1) {
      return 2;
    }
    strcpy(str,reason_code_name[2]);
  }
  else if (rt == Internal_Error) {
    sVar1 = strlen(reason_code_name[4]);
    if (len <= sVar1) {
      return 4;
    }
    strcpy(str,reason_code_name[4]);
  }
  else if (rt == Not_implemented) {
    sVar1 = strlen(reason_code_name[5]);
    if (len <= sVar1) {
      return 5;
    }
    strcpy(str,reason_code_name[5]);
  }
  return 0;
}

Assistant:

int reason_code_to_str(char *str, size_t len, http_reason_code_t rt)
{

  size_t reason_code_size;

  switch(rt)
    {
    case Bad_Request:
      reason_code_size=strlen(reason_code_name[0]);
      if(len <= reason_code_size)
        return 1;
      strcpy(str, reason_code_name[0]);
      break;
    case Not_found:
      reason_code_size=strlen(reason_code_name[1]);
      if(len <= reason_code_size)
        return 2;
      strcpy(str,reason_code_name[1]);
      break;
    case Entity_Too_Large:
      reason_code_size=strlen(reason_code_name[2]);
      if(len <= reason_code_size)
        return 2;
      strcpy(str,reason_code_name[2]);
      break;
    case OK:
      reason_code_size=strlen(reason_code_name[3]);
      if(len <= reason_code_size)
        return 3;
      strcpy(str,reason_code_name[3]);
      break;
    case Internal_Error:
      reason_code_size=strlen(reason_code_name[4]);
      if(len <= reason_code_size)
        return 4;
      strcpy(str,reason_code_name[4]);
      break;
    case Not_implemented:
      reason_code_size=strlen(reason_code_name[5]);
      if(len <= reason_code_size)
        return 5;
      strcpy(str,reason_code_name[5]);
      break;
    }
  return 0;
}